

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::~UEFITool(UEFITool *this)

{
  ~UEFITool((UEFITool *)&this[-1].version.d.size);
  return;
}

Assistant:

UEFITool::~UEFITool()
{
    delete ffsBuilder;
    delete ffsOps;
    delete ffsFinder;
    delete ffsParser;
    delete ffsReport;
    delete model;
    delete hexViewDialog;
    delete searchDialog;
    delete ui;
}